

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

void __thiscall glslang::TProgram::~TProgram(TProgram *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TInfoSink *pTVar2;
  pointer pcVar3;
  TIntermediate *this_00;
  TPoolAllocator *this_01;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined8 *puVar7;
  
  this->_vptr_TProgram = (_func_int **)&PTR__TProgram_0093ac40;
  pTVar2 = this->infoSink;
  if (pTVar2 != (TInfoSink *)0x0) {
    pcVar3 = (pTVar2->debug).sink._M_dataplus._M_p;
    paVar1 = &(pTVar2->debug).sink.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pTVar2->info).sink._M_dataplus._M_p;
    paVar1 = &(pTVar2->info).sink.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pTVar2,0x60);
  }
  if (this->reflection != (TReflection *)0x0) {
    (*this->reflection->_vptr_TReflection[1])();
  }
  lVar6 = -0xe;
  do {
    if ((this->newedIntermediate[lVar6 + 0xe] == true) &&
       (this_00 = *(TIntermediate **)(this->newedIntermediate + lVar6 * 8),
       this_00 != (TIntermediate *)0x0)) {
      TIntermediate::~TIntermediate(this_00);
      operator_delete(this_00,0x7e8);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  this_01 = this->pool;
  if (this_01 != (TPoolAllocator *)0x0) {
    TPoolAllocator::~TPoolAllocator(this_01);
    operator_delete(this_01,0x60);
  }
  lVar6 = 0x160;
  do {
    puVar7 = (undefined8 *)((long)this->stages + lVar6 + -0x28);
    puVar5 = (undefined8 *)*puVar7;
    while (puVar5 != puVar7) {
      puVar4 = (undefined8 *)*puVar5;
      operator_delete(puVar5,0x18);
      puVar5 = puVar4;
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0x10);
  return;
}

Assistant:

TProgram::~TProgram()
{
    delete infoSink;
    delete reflection;

    for (int s = 0; s < EShLangCount; ++s)
        if (newedIntermediate[s])
            delete intermediate[s];

    delete pool;
}